

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_symbol.hpp
# Opt level: O0

rt_expression_interface<double> * __thiscall
viennamath::rt_function_symbol<viennamath::rt_expression_interface<double>_>::diff
          (rt_function_symbol<viennamath::rt_expression_interface<double>_> *this,
          rt_expression_interface<double> *diff_var)

{
  id_type iVar1;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> *prVar2;
  expression_not_differentiable_exception *this_00;
  rt_function_symbol<viennamath::rt_expression_interface<double>_> *local_78;
  allocator<char> local_59;
  string local_58;
  rt_function_symbol<viennamath::rt_expression_interface<double>_> *local_28;
  self_type *ptr;
  rt_expression_interface<double> *diff_var_local;
  rt_function_symbol<viennamath::rt_expression_interface<double>_> *this_local;
  
  ptr = (self_type *)diff_var;
  diff_var_local = &this->super_rt_expression_interface<double>;
  if (diff_var == (rt_expression_interface<double> *)0x0) {
    local_78 = (rt_function_symbol<viennamath::rt_expression_interface<double>_> *)0x0;
  }
  else {
    local_78 = (rt_function_symbol<viennamath::rt_expression_interface<double>_> *)
               __dynamic_cast(diff_var,&rt_expression_interface<double>::typeinfo,
                              &rt_function_symbol<viennamath::rt_expression_interface<double>>::
                               typeinfo,0);
  }
  local_28 = local_78;
  if (local_78 != (rt_function_symbol<viennamath::rt_expression_interface<double>_> *)0x0) {
    iVar1 = id(local_78);
    if ((iVar1 == this->id_) && (iVar1 = tag_id(local_28), iVar1 == this->tag_id_)) {
      prVar2 = (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)
               operator_new(0x10);
      rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant(prVar2,1.0);
      return &prVar2->super_rt_expression_interface<double>;
    }
    prVar2 = (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)operator_new(0x10)
    ;
    rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant(prVar2,0.0);
    return &prVar2->super_rt_expression_interface<double>;
  }
  this_00 = (expression_not_differentiable_exception *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Cannot differentiate rt_function_symbol!",&local_59);
  expression_not_differentiable_exception::expression_not_differentiable_exception
            (this_00,&local_58);
  __cxa_throw(this_00,&expression_not_differentiable_exception::typeinfo,
              expression_not_differentiable_exception::~expression_not_differentiable_exception);
}

Assistant:

InterfaceType * diff(const InterfaceType * diff_var) const
      {
        const self_type * ptr = dynamic_cast< const self_type *>(diff_var);
        if (ptr != NULL)
        {
          //std::cout << "diff variable<" << id << ">: TRUE" << std::endl;
          if (ptr->id() == id_ && ptr->tag_id() == tag_id_)
            return new rt_constant<numeric_type, InterfaceType>(1);
          else
            //std::cout << "diff variable<" << id << ">: FALSE, is: " << diff_var.get()->str() << std::endl;
            return new rt_constant<numeric_type, InterfaceType>(0);
        }

        // the derivative of a function symbol with respect to a variable should not be triggered here. TODO: Maybe move higher-level code here?
        throw expression_not_differentiable_exception("Cannot differentiate rt_function_symbol!");
        return NULL;
      }